

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * get_graph_by_value_abi_cxx11_(string *__return_storage_ptr__,uint value,uint max,uint len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (ulong)((float)len * (float)((double)value / ((double)max + -0.1)));
  uVar2 = uVar3 & 0xffffffff;
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (; (uint)uVar3 < len; uVar3 = (ulong)((uint)uVar3 + 1)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_graph_by_value( unsigned value, unsigned max, unsigned len )
{
  unsigned step = 0;
  std::string bars;

  unsigned bar_count = ( static_cast<float>( value / ( max - 0.1 ) ) * len );

  for( ; step < bar_count; step++ )
  {
    bars.append( "|" );
  }
  for( ; step < len; step++ )
  {
    bars.append( " " );
  }

  return bars;
}